

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_size nk_progress_behavior
                  (nk_flags *state,nk_input *in,nk_rect r,nk_rect cursor,nk_size max,nk_size value,
                  int modifiable)

{
  int iVar1;
  nk_size nVar2;
  bool bVar3;
  bool bVar4;
  float local_a0;
  float local_9c;
  float local_94;
  float local_8c;
  float local_88;
  float local_80;
  float local_7c;
  float local_74;
  float local_6c;
  float local_68;
  float ratio;
  int left_mouse_click_in_cursor;
  int left_mouse_down;
  int modifiable_local;
  nk_size value_local;
  nk_size max_local;
  nk_input *in_local;
  nk_flags *state_local;
  nk_rect cursor_local;
  nk_rect r_local;
  
  state_local._0_4_ = cursor.x;
  cursor_local.x = cursor.w;
  if ((*state & 2) == 0) {
    *state = 4;
  }
  else {
    *state = 6;
  }
  r_local._8_8_ = value;
  if ((in != (nk_input *)0x0) && (modifiable != 0)) {
    bVar3 = false;
    if (in != (nk_input *)0x0) {
      bVar3 = (in->mouse).buttons[0].down != 0;
    }
    bVar4 = false;
    if (in != (nk_input *)0x0) {
      iVar1 = nk_input_has_mouse_click_down_in_rect(in,NK_BUTTON_LEFT,cursor,1);
      bVar4 = iVar1 != 0;
    }
    iVar1 = nk_input_is_mouse_hovering_rect(in,r);
    if (iVar1 != 0) {
      *state = 0x12;
    }
    _left_mouse_down = value;
    if ((((in != (nk_input *)0x0) && (bVar3)) && (bVar4)) && ((bVar3 && (bVar4)))) {
      if ((in->mouse).pos.x - state_local._0_4_ <= 0.0) {
        local_68 = 0.0;
      }
      else {
        local_68 = (in->mouse).pos.x - state_local._0_4_;
      }
      local_68 = local_68 / cursor_local.x;
      local_6c = (float)max;
      if (local_6c <= local_6c * local_68) {
        local_80 = (float)max;
        local_7c = local_80;
      }
      else {
        local_74 = (float)max;
        local_7c = local_74 * local_68;
      }
      if (0.0 <= local_7c) {
        local_8c = (float)max;
        if (local_8c <= local_8c * local_68) {
          local_a0 = (float)max;
          local_9c = local_a0;
        }
        else {
          local_94 = (float)max;
          local_9c = local_94 * local_68;
        }
        local_88 = local_9c;
      }
      else {
        local_88 = 0.0;
      }
      _left_mouse_down = (long)local_88 | (long)(local_88 - 9.223372e+18) & (long)local_88 >> 0x3f;
      (in->mouse).buttons[0].clicked_pos.x = state_local._0_4_ + cursor_local.x / 2.0;
      *state = *state | 0x22;
    }
    if (((*state & 0x10) == 0) || (iVar1 = nk_input_is_mouse_prev_hovering_rect(in,r), iVar1 != 0))
    {
      iVar1 = nk_input_is_mouse_prev_hovering_rect(in,r);
      if (iVar1 != 0) {
        *state = *state | 0x40;
      }
    }
    else {
      *state = *state | 8;
    }
    r_local.w = (float)left_mouse_down;
    r_local.h = (float)modifiable_local;
  }
  nVar2._0_4_ = r_local.w;
  nVar2._4_4_ = r_local.h;
  return nVar2;
}

Assistant:

NK_LIB nk_size
nk_progress_behavior(nk_flags *state, struct nk_input *in,
    struct nk_rect r, struct nk_rect cursor, nk_size max, nk_size value, int modifiable)
{
    int left_mouse_down = 0;
    int left_mouse_click_in_cursor = 0;

    nk_widget_state_reset(state);
    if (!in || !modifiable) return value;
    left_mouse_down = in && in->mouse.buttons[NK_BUTTON_LEFT].down;
    left_mouse_click_in_cursor = in && nk_input_has_mouse_click_down_in_rect(in,
            NK_BUTTON_LEFT, cursor, nk_true);
    if (nk_input_is_mouse_hovering_rect(in, r))
        *state = NK_WIDGET_STATE_HOVERED;

    if (in && left_mouse_down && left_mouse_click_in_cursor) {
        if (left_mouse_down && left_mouse_click_in_cursor) {
            float ratio = NK_MAX(0, (float)(in->mouse.pos.x - cursor.x)) / (float)cursor.w;
            value = (nk_size)NK_CLAMP(0, (float)max * ratio, (float)max);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = cursor.x + cursor.w/2.0f;
            *state |= NK_WIDGET_STATE_ACTIVE;
        }
    }
    /* set progressbar widget state */
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, r))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, r))
        *state |= NK_WIDGET_STATE_LEFT;
    return value;
}